

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_RemoveWindowMappingByTarget(GPU_Target *target)

{
  GPU_Context *pGVar1;
  ulong uVar2;
  ulong uVar3;
  GPU_WindowMapping *__dest;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  if (((target != (GPU_Target *)0x0) && (pGVar1 = target->context, pGVar1 != (GPU_Context *)0x0)) &&
     (pGVar1->windowID != 0)) {
    pGVar1->windowID = 0;
    uVar2 = 0;
    uVar3 = 0;
    __dest = _gpu_window_mappings;
    if (0 < _gpu_num_window_mappings) {
      uVar3 = (ulong)(uint)_gpu_num_window_mappings;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      if (__dest->target == target) {
        _gpu_num_window_mappings = _gpu_num_window_mappings - 1;
        if ((int)((uint)_gpu_num_window_mappings - uVar2) < 1) {
          return;
        }
        memmove(__dest,__dest + 1,((uint)_gpu_num_window_mappings - uVar2 & 0xffffffff) << 4);
        return;
      }
      __dest = __dest + 1;
    }
  }
  return;
}

Assistant:

void GPU_RemoveWindowMappingByTarget(GPU_Target* target)
{
    Uint32 windowID;
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(target == NULL || target->context == NULL)
        return;

    windowID = target->context->windowID;
    if(windowID == 0)  // Invalid window ID
        return;

    // Unset the target's window
    target->context->windowID = 0;

    // Find the occurrences
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].target == target)
        {
            // Move the remaining entries to replace the removed one
            int num_to_move;
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}